

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.h
# Opt level: O2

void __thiscall
Js::JavascriptNativeArray::SetArrayCallSite
          (JavascriptNativeArray *this,ProfileId index,
          RecyclerWeakReference<Js::FunctionBody> *weakRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (weakRef == (RecyclerWeakReference<Js::FunctionBody> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.h"
                                ,0x3f4,"(weakRef)","weakRef");
    if (!bVar2) goto LAB_0096f681;
    *puVar3 = 0;
  }
  if ((this->weakRefToFuncBody).ptr != (RecyclerWeakReference<Js::FunctionBody> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.h"
                                ,0x3f5,"(!weakRefToFuncBody)","!weakRefToFuncBody");
    if (!bVar2) {
LAB_0096f681:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  DynamicObject::SetArrayCallSiteIndex((DynamicObject *)this,index);
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>::WriteBarrierSet
            (&this->weakRefToFuncBody,weakRef);
  return;
}

Assistant:

void SetArrayCallSite(ProfileId index, RecyclerWeakReference<FunctionBody> *weakRef)
        {
            Assert(weakRef);
            Assert(!weakRefToFuncBody);
            SetArrayCallSiteIndex(index);
            weakRefToFuncBody = weakRef;
        }